

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O3

bool pbrt::anon_unknown_4::initArg(string *str,span<int> out)

{
  long in_RCX;
  size_t __n;
  string_view str_00;
  vector<int,_std::allocator<int>_> v;
  vector<int,_std::allocator<int>_> local_38;
  
  str_00._M_len = out.ptr;
  str_00._M_str = (char *)str;
  SplitStringToInts(&local_38,str_00,',');
  __n = (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish -
        (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
  if ((long)__n >> 2 == in_RCX && __n != 0) {
    memmove((void *)out.n,
            local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start,__n);
  }
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (long)__n >> 2 == in_RCX;
}

Assistant:

bool initArg(const std::string &str, pstd::span<int> out) {
    std::vector<int> v = SplitStringToInts(str, ',');
    if (v.size() != out.size())
        return false;
    std::copy(v.begin(), v.end(), out.begin());
    return true;
}